

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

ssize_t __thiscall
Liby::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 __p;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_68 [16];
  io_task task;
  long local_20;
  off_t len_local;
  
  local_20 = CONCAT44(in_register_00000034,__fd);
  task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  task.handler_._M_t.
  super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>._M_t.
  super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>.
  super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
        )(__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>)0x0
  ;
  task.offset_ = 0;
  task.len_ = 0;
  task.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  task.fp_.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  len_local = (off_t)__buf;
  std::make_shared<Liby::Buffer,char_const*,long&>((char **)local_68,&local_20);
  std::__shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&task.buffer_.super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  if (*(long *)(__n + 0x10) != 0) {
    std::make_unique<std::function<void()>,std::function<void()>const&>
              ((function<void_()> *)local_68);
    __p = local_68._0_8_;
    local_68._0_8_ = (element_type *)0x0;
    std::__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    reset((__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *)
          &task.handler_,(pointer)__p);
    std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
    ~unique_ptr((unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_> *
                )local_68);
  }
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::emplace_back<Liby::io_task>
            (&this->writTasks_,&task);
  enableWrit(this,true);
  io_task::~io_task(&task);
  return extraout_RAX;
}

Assistant:

void Connection::send(const char *base, off_t len,
                      const BasicHandler &handler) {
    io_task task;
    task.buffer_ =
        std::make_shared<Buffer>(static_cast<const char *>(base), len);
    if (handler) {
        task.handler_ = std::make_unique<BasicHandler>(handler);
    }
    writTasks_.emplace_back(std::move(task));
    enableWrit();
}